

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O1

Bool prvTidyAdjustCharEncoding(TidyDocImpl *doc,int encoding)

{
  ulong val;
  ulong val_00;
  ulong val_01;
  
  val = (ulong)(uint)encoding;
  if ((uint)encoding < 0xe) {
    val_00 = *(ulong *)(&DAT_00158558 + val * 8);
    val_01 = (ulong)*(uint *)(&DAT_001585c8 + val * 4);
  }
  else {
    val_01 = 0xffffffff;
    val_00 = 0xffffffffffffffff;
  }
  if ((uint)encoding < 0xe) {
    prvTidySetOptionInt(doc,TidyCharEncoding,val);
    prvTidySetOptionInt(doc,TidyInCharEncoding,val_01);
    prvTidySetOptionInt(doc,TidyOutCharEncoding,val_00);
  }
  return (uint)((uint)encoding < 0xe);
}

Assistant:

Bool  TY_(AdjustCharEncoding)( TidyDocImpl* doc, int encoding )
{
    int outenc = -1;
    int inenc = -1;
    
    switch( encoding )
    {
    case MACROMAN:
        inenc = MACROMAN;
        outenc = ASCII;
        break;

    case WIN1252:
        inenc = WIN1252;
        outenc = ASCII;
        break;

    case IBM858:
        inenc = IBM858;
        outenc = ASCII;
        break;

    case ASCII:
        inenc = LATIN1;
        outenc = ASCII;
        break;

    case LATIN0:
        inenc = LATIN0;
        outenc = ASCII;
        break;

    case RAW:
    case LATIN1:
    case UTF8:
#ifndef NO_NATIVE_ISO2022_SUPPORT
    case ISO2022:
#endif

    case UTF16LE:
    case UTF16BE:
    case UTF16:
    case SHIFTJIS:
    case BIG5:
        inenc = outenc = encoding;
        break;
    }

    if ( inenc >= 0 )
    {
        TY_(SetOptionInt)( doc, TidyCharEncoding, encoding );
        TY_(SetOptionInt)( doc, TidyInCharEncoding, inenc );
        TY_(SetOptionInt)( doc, TidyOutCharEncoding, outenc );
        return yes;
    }
    return no;
}